

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-spell.c
# Opt level: O1

wchar_t spell_book_count_spells(player *p,object *obj,_func__Bool_player_ptr_wchar_t *tester)

{
  _Bool _Var1;
  long lVar2;
  class_book *pcVar3;
  long lVar4;
  wchar_t wVar5;
  
  lVar2 = (long)(p->class->magic).num_books;
  if (0 < lVar2) {
    pcVar3 = (p->class->magic).books;
    do {
      if ((pcVar3->tval == (uint)obj->tval) && (pcVar3->sval == (uint)obj->sval)) goto LAB_001bebb1;
      pcVar3 = pcVar3 + 1;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  pcVar3 = (class_book *)0x0;
LAB_001bebb1:
  wVar5 = L'\0';
  if ((pcVar3 != (class_book *)0x0) && (wVar5 = L'\0', L'\0' < pcVar3->num_spells)) {
    lVar4 = 0;
    lVar2 = 0x20;
    wVar5 = L'\0';
    do {
      _Var1 = (*tester)(p,*(wchar_t *)((long)&pcVar3->spells->name + lVar2));
      wVar5 = wVar5 + (uint)_Var1;
      lVar4 = lVar4 + 1;
      lVar2 = lVar2 + 0x38;
    } while (lVar4 < pcVar3->num_spells);
  }
  return wVar5;
}

Assistant:

int spell_book_count_spells(const struct player *p, const struct object *obj,
		bool (*tester)(const struct player *p, int spell))
{
	const struct class_book *book = player_object_to_book(p, obj);
	int i, n_spells = 0;

	if (!book) {
		return n_spells;
	}

	for (i = 0; i < book->num_spells; i++)
		if (tester(p, book->spells[i].sidx))
			n_spells++;

	return n_spells;
}